

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O3

void Gia_ManProfileCollect
               (Gia_Man_t *p,int i,Vec_Int_t *vCode,Vec_Int_t *vCodeOffsets,Vec_Int_t *vArray)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  vArray->nSize = 0;
  if (((-1 < i) && (i < vCodeOffsets->nSize)) && (uVar2 = i + 1, uVar2 < (uint)vCodeOffsets->nSize))
  {
    uVar1 = vCodeOffsets->pArray[(uint)i];
    uVar3 = (ulong)uVar1;
    do {
      if (vCodeOffsets->pArray[uVar2] <= (int)uVar3) {
        return;
      }
      if (((int)uVar1 < 0) || (vCode->nSize <= (int)uVar3)) break;
      Vec_IntPush(vArray,vCode->pArray[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((int)uVar2 < vCodeOffsets->nSize);
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Gia_ManProfileCollect( Gia_Man_t * p, int i, Vec_Int_t * vCode, Vec_Int_t * vCodeOffsets, Vec_Int_t * vArray )
{
    int k;
    Vec_IntClear( vArray );
    for ( k = Vec_IntEntry(vCodeOffsets, i); k < Vec_IntEntry(vCodeOffsets, i+1); k++ )
        Vec_IntPush( vArray, Vec_IntEntry(vCode, k) );
}